

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unidim-lipm-dcm-estimator.cpp
# Opt level: O0

void __thiscall
stateObservation::UnidimLipmDcmEstimator::UnidimLipmDcmEstimator
          (UnidimLipmDcmEstimator *this,double dt,double omega_0,double biasDriftStd,double initDcm,
          double initZMP,double initBias,double dcmMeasureErrorStd,double zmpMeasureErrorStd,
          double initDcmUncertainty,double initBiasUncertainty)

{
  CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *pCVar1;
  Pmatrix local_1b0;
  double local_198;
  Scalar local_190;
  Scalar local_188;
  double local_180;
  CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> local_178;
  undefined1 local_158 [8];
  Matrix2 P;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_128;
  undefined1 local_108 [8];
  Vector2 x;
  Rmatrix local_f0;
  non_const_type local_d8;
  Cmatrix local_d0;
  double local_b8;
  CommaInitializer<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> local_b0;
  Scalar local_90;
  Scalar local_88;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_80;
  double local_50;
  double zmpMeasureErrorStd_local;
  double dcmMeasureErrorStd_local;
  double initBias_local;
  double initZMP_local;
  double initDcm_local;
  double biasDriftStd_local;
  double omega_0_local;
  double dt_local;
  UnidimLipmDcmEstimator *this_local;
  
  this->omega0_ = omega_0;
  this->dt_ = dt;
  this->biasDriftStd_ = biasDriftStd;
  this->zmpErrorStd_ = zmpMeasureErrorStd;
  this->previousZmp_ = initZMP;
  local_50 = zmpMeasureErrorStd;
  zmpMeasureErrorStd_local = dcmMeasureErrorStd;
  dcmMeasureErrorStd_local = initBias;
  initBias_local = initZMP;
  initZMP_local = initDcm;
  initDcm_local = biasDriftStd;
  biasDriftStd_local = omega_0;
  omega_0_local = dt;
  dt_local = (double)this;
  LinearKalmanFilter::LinearKalmanFilter(&this->filter_,2,1,1);
  Eigen::Matrix<double,_2,_2,_0,_2,_2>::Matrix(&this->A_);
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix(&this->B_);
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix(&this->C_);
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix(&this->R_);
  Eigen::Matrix<double,_2,_2,_0,_2,_2>::Matrix(&this->Q_);
  updateMatricesABQ_(this);
  local_88 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator<<
            (&local_80,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&this->C_,&local_88);
  local_90 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_(&local_80,&local_90);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CommaInitializer(&local_80);
  local_b8 = tools::square<double>(&zmpMeasureErrorStd_local);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::operator<<
            (&local_b0,(DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)&this->R_,&local_b8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::~CommaInitializer(&local_b0);
  local_d8 = (non_const_type)
             Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::transpose
                       ((DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&this->C_);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Transpose<Eigen::Matrix<double,2,1,0,2,1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_d0,
             (EigenBase<Eigen::Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_> *)&local_d8);
  KalmanFilterBase::setC(&(this->filter_).super_KalmanFilterBase,&local_d0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_d0);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,1,1,0,1,1>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_f0,
             (EigenBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)&this->R_);
  KalmanFilterBase::setMeasurementCovariance(&(this->filter_).super_KalmanFilterBase,&local_f0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_f0);
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)local_108);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator<<
            (&local_128,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_108,&initZMP_local
            );
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
            (&local_128,&dcmMeasureErrorStd_local);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CommaInitializer(&local_128);
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,2,1,0,2,1>>
            ((Matrix<double,_1,1,0,_1,1> *)
             (P.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
             + 3),(EigenBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_108);
  ZeroDelayObserver::setState
            ((ZeroDelayObserver *)&this->filter_,
             (StateVector *)
             (P.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
             + 3),0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             (P.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
             + 3));
  Eigen::Matrix<double,_2,_2,_0,_2,_2>::Matrix((Matrix<double,_2,_2,_0,_2,_2> *)local_158);
  local_180 = tools::square<double>(&initDcmUncertainty);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator<<
            (&local_178,(DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)local_158,&local_180);
  local_188 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                     (&local_178,&local_188);
  local_190 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                     (pCVar1,&local_190);
  local_198 = tools::square<double>(&initBiasUncertainty);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_(pCVar1,&local_198);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::~CommaInitializer(&local_178);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,2,2,0,2,2>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_1b0,
             (EigenBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)local_158);
  KalmanFilterBase::setStateCovariance(&(this->filter_).super_KalmanFilterBase,&local_1b0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_1b0);
  return;
}

Assistant:

UnidimLipmDcmEstimator::UnidimLipmDcmEstimator(double dt,
                                               double omega_0,
                                               double biasDriftStd,
                                               double initDcm,
                                               double initZMP,
                                               double initBias,
                                               double dcmMeasureErrorStd,
                                               double zmpMeasureErrorStd,
                                               double initDcmUncertainty,
                                               double initBiasUncertainty)
: omega0_(omega_0), dt_(dt), biasDriftStd_(biasDriftStd), zmpErrorStd_(zmpMeasureErrorStd), previousZmp_(initZMP),
  filter_(2, 1, 1)
{
  updateMatricesABQ_();
  C_ << 1., 1.;
  R_ << square(dcmMeasureErrorStd);
  filter_.setC(C_.transpose());
  filter_.setMeasurementCovariance(R_);
  Vector2 x;
  x << initDcm, initBias;
  filter_.setState(x, 0);
  Matrix2 P;
  // clang-format off
  P<< square(initDcmUncertainty),  0,
      0,                           square(initBiasUncertainty);
  // clang-format on
  filter_.setStateCovariance(P);
}